

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

void Gia_ManDupAndConesLimit2_rec(Gia_Man_t *pNew,Gia_Man_t *p,int iObj,int Level)

{
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  
  if ((iObj < 0) || (p->nObjs <= iObj)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                  ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  if (p->pObjs[(uint)iObj].Value == 0xffffffff) {
    pGVar1 = p->pObjs + (uint)iObj;
    if (((Level < 1) || (uVar4 = (uint)*(ulong *)pGVar1, (*(ulong *)pGVar1 & 0x80000000) != 0)) ||
       ((uVar4 & 0x1fffffff) == 0x1fffffff)) {
      pGVar5 = Gia_ManAppendObj(pNew);
      uVar2 = *(ulong *)pGVar5;
      *(ulong *)pGVar5 = uVar2 | 0x9fffffff;
      *(ulong *)pGVar5 =
           uVar2 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(pNew->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar3 = pNew->pObjs;
      if ((pGVar5 < pGVar3) || (pGVar3 + pNew->nObjs <= pGVar5)) {
LAB_001eb7ef:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(pNew->vCis,(int)((ulong)((long)pGVar5 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar3 = pNew->pObjs;
      if ((pGVar5 < pGVar3) || (pGVar3 + pNew->nObjs <= pGVar5)) goto LAB_001eb7ef;
      uVar4 = (int)((ulong)((long)pGVar5 - (long)pGVar3) >> 2) * 0x55555556;
    }
    else {
      Gia_ManDupAndConesLimit2_rec(pNew,p,iObj - (uVar4 & 0x1fffffff),Level + -1);
      Gia_ManDupAndConesLimit2_rec
                (pNew,p,iObj - (*(uint *)&pGVar1->field_0x4 & 0x1fffffff),Level + -1);
      uVar2 = *(ulong *)pGVar1;
      if (((int)pGVar1[-(ulong)((uint)uVar2 & 0x1fffffff)].Value < 0) ||
         (uVar4 = (uint)(uVar2 >> 0x20), (int)pGVar1[-(ulong)(uVar4 & 0x1fffffff)].Value < 0)) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar4 = Gia_ManAppendAnd(pNew,(uint)(uVar2 >> 0x1d) & 1 ^
                                    pGVar1[-(ulong)((uint)uVar2 & 0x1fffffff)].Value,
                               pGVar1[-(ulong)(uVar4 & 0x1fffffff)].Value ^ uVar4 >> 0x1d & 1);
    }
    pGVar1->Value = uVar4;
  }
  return;
}

Assistant:

void Gia_ManDupAndConesLimit2_rec( Gia_Man_t * pNew, Gia_Man_t * p, int iObj, int Level )
{
    Gia_Obj_t * pObj = Gia_ManObj(p, iObj);
    if ( ~pObj->Value )
        return;
    if ( !Gia_ObjIsAnd(pObj) || Level <= 0 )
    {
        pObj->Value = Gia_ManAppendCi( pNew );
        //printf( "PI %d for %d.\n", Abc_Lit2Var(pObj->Value), iObj );
        return;
    }
    Gia_ManDupAndConesLimit2_rec( pNew, p, Gia_ObjFaninId0(pObj, iObj), Level-1 );
    Gia_ManDupAndConesLimit2_rec( pNew, p, Gia_ObjFaninId1(pObj, iObj), Level-1 );
    pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    //printf( "Obj %d for %d.\n", Abc_Lit2Var(pObj->Value), iObj );
}